

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::IfcRailing(IfcRailing *this)

{
  IfcRailing *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x180,"IfcRailing");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__01096c90);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>,
             &PTR_construction_vtable_24__01096dc8);
  *(undefined8 *)this = 0x1096b60;
  *(undefined8 *)&this->field_0x180 = 0x1096c78;
  *(undefined8 *)&this->field_0x88 = 0x1096b88;
  *(undefined8 *)&this->field_0x98 = 0x1096bb0;
  *(undefined8 *)&this->field_0xd0 = 0x1096bd8;
  *(undefined8 *)&this->field_0x100 = 0x1096c00;
  *(undefined8 *)&this->field_0x138 = 0x1096c28;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x1096c50;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x10);
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}